

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# namingConventions.cpp
# Opt level: O3

void namingConventions::adjustForAllFiles
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *inputFiles,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *oldNames,vector<Pda_*,_std::allocator<Pda_*>_> *pdas,bool forClass)

{
  Pda *this;
  pointer pbVar1;
  pointer pcVar2;
  char cVar3;
  bool bVar4;
  istream *piVar5;
  pointer ppPVar6;
  undefined7 in_register_00000009;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  ulong uVar9;
  ulong uVar10;
  __string_type __str;
  string word;
  string editedstring;
  string longestFit;
  string line;
  ofstream editedFile;
  fstream buffer;
  string local_590;
  string local_570;
  undefined4 local_54c;
  char *local_548;
  long local_540;
  char local_538;
  undefined7 uStack_537;
  string local_528;
  undefined1 *local_508;
  ulong local_500;
  undefined1 local_4f8;
  undefined7 uStack_4f7;
  pointer local_4e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_4e0;
  undefined1 *local_4d8;
  undefined8 local_4d0;
  undefined1 local_4c8;
  undefined7 uStack_4c7;
  string local_4b8;
  string local_498;
  string local_478;
  undefined8 local_458;
  long local_450;
  pointer local_448;
  long local_440;
  filebuf local_438 [120];
  ios_base local_3c0 [120];
  ios_base local_348 [264];
  long local_240 [66];
  
  local_54c = (undefined4)CONCAT71(in_register_00000009,forClass);
  local_4e8 = (inputFiles->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  local_448 = (inputFiles->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (local_4e8 != local_448) {
    local_450 = _VTT;
    local_458 = _memcpy;
    local_4e0 = oldNames;
    do {
      std::fstream::fstream(local_240,(local_4e8->_M_dataplus)._M_p,_S_out|_S_in);
      local_4d8 = &local_4c8;
      local_4d0 = 0;
      local_4c8 = 0;
      local_548 = &local_538;
      local_540 = 0;
      local_538 = '\0';
      while( true ) {
        cVar3 = std::ios::widen((char)*(undefined8 *)(local_240[0] + -0x18) +
                                (char)(istream *)local_240);
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_240,(string *)&local_4d8,cVar3);
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)&local_440,(string *)&local_4d8,_S_out|_S_in);
        local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
        local_570._M_string_length = 0;
        local_570.field_2._M_local_buf[0] = '\0';
        while( true ) {
          piVar5 = std::operator>>((istream *)&local_440,(string *)&local_570);
          if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
          local_508 = &local_4f8;
          local_500 = 0;
          local_4f8 = 0;
          ppPVar6 = (pdas->super__Vector_base<Pda_*,_std::allocator<Pda_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          if ((pdas->super__Vector_base<Pda_*,_std::allocator<Pda_*>_>)._M_impl.
              super__Vector_impl_data._M_finish == ppPVar6) {
LAB_00107113:
            local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_590,local_570._M_dataplus._M_p,
                       local_570._M_dataplus._M_p + local_570._M_string_length);
            std::__cxx11::string::_M_replace_aux
                      ((ulong)&local_590,local_590._M_string_length,0,'\x01');
            std::__cxx11::string::_M_append((char *)&local_548,(ulong)local_590._M_dataplus._M_p);
          }
          else {
            uVar9 = 0;
            uVar10 = 1;
            do {
              this = ppPVar6[uVar9];
              local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_4b8,local_570._M_dataplus._M_p,
                         local_570._M_dataplus._M_p + local_570._M_string_length);
              bVar4 = Pda::traverse(this,&local_4b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
                operator_delete(local_4b8._M_dataplus._M_p,
                                local_4b8.field_2._M_allocated_capacity + 1);
              }
              if (bVar4) {
                if ((char)local_54c == '\0') {
                  pbVar1 = (local_4e0->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
                  pcVar2 = pbVar1[uVar9]._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_498,pcVar2,pcVar2 + pbVar1[uVar9]._M_string_length);
                  correctName(&local_528,&local_498);
                  editToNewName(&local_590,&local_570,pbVar1 + uVar9,&local_528);
                  std::__cxx11::string::operator=((string *)&local_570,(string *)&local_590);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_590._M_dataplus._M_p != &local_590.field_2) {
                    operator_delete(local_590._M_dataplus._M_p,
                                    local_590.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_528._M_dataplus._M_p != &local_528.field_2) {
                    operator_delete(local_528._M_dataplus._M_p,
                                    local_528.field_2._M_allocated_capacity + 1);
                  }
                  uVar7 = local_498.field_2._M_allocated_capacity;
                  _Var8._M_p = local_498._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_498._M_dataplus._M_p != &local_498.field_2) goto LAB_00107059;
                }
                else {
                  pbVar1 = (local_4e0->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
                  pcVar2 = pbVar1[uVar9]._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_478,pcVar2,pcVar2 + pbVar1[uVar9]._M_string_length);
                  correctClassName(&local_528,&local_478);
                  editToNewName(&local_590,&local_570,pbVar1 + uVar9,&local_528);
                  std::__cxx11::string::operator=((string *)&local_570,(string *)&local_590);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_590._M_dataplus._M_p != &local_590.field_2) {
                    operator_delete(local_590._M_dataplus._M_p,
                                    local_590.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_528._M_dataplus._M_p != &local_528.field_2) {
                    operator_delete(local_528._M_dataplus._M_p,
                                    local_528.field_2._M_allocated_capacity + 1);
                  }
                  uVar7 = local_478.field_2._M_allocated_capacity;
                  _Var8._M_p = local_478._M_dataplus._M_p;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_478._M_dataplus._M_p != &local_478.field_2) {
LAB_00107059:
                    operator_delete(_Var8._M_p,uVar7 + 1);
                  }
                }
                if (local_500 < local_570._M_string_length) {
                  std::__cxx11::string::_M_assign((string *)&local_508);
                }
              }
              ppPVar6 = (pdas->super__Vector_base<Pda_*,_std::allocator<Pda_*>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              bVar4 = uVar10 < (ulong)((long)(pdas->
                                             super__Vector_base<Pda_*,_std::allocator<Pda_*>_>).
                                             _M_impl.super__Vector_impl_data._M_finish -
                                       (long)ppPVar6 >> 3);
              uVar9 = uVar10;
              uVar10 = (ulong)((int)uVar10 + 1);
            } while (bVar4);
            if (local_500 == 0) goto LAB_00107113;
            local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_590,local_508,local_508 + local_500);
            std::__cxx11::string::_M_replace_aux
                      ((ulong)&local_590,local_590._M_string_length,0,'\x01');
            std::__cxx11::string::_M_append((char *)&local_548,(ulong)local_590._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_590._M_dataplus._M_p != &local_590.field_2) {
            operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
          }
          if (local_508 != &local_4f8) {
            operator_delete(local_508,CONCAT71(uStack_4f7,local_4f8) + 1);
          }
        }
        std::__cxx11::string::append((char *)&local_548);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_570._M_dataplus._M_p != &local_570.field_2) {
          operator_delete(local_570._M_dataplus._M_p,
                          CONCAT71(local_570.field_2._M_allocated_capacity._1_7_,
                                   local_570.field_2._M_local_buf[0]) + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&local_440);
        std::ios_base::~ios_base(local_3c0);
      }
      std::fstream::close();
      std::ofstream::ofstream((stringstream *)&local_440);
      std::ofstream::open((string *)&local_440,(_Ios_Openmode)local_4e8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_440,local_548,local_540);
      std::ofstream::close();
      local_440 = local_450;
      *(undefined8 *)(local_438 + *(long *)(local_450 + -0x18) + -8) = local_458;
      std::filebuf::~filebuf(local_438);
      std::ios_base::~ios_base(local_348);
      if (local_548 != &local_538) {
        operator_delete(local_548,CONCAT71(uStack_537,local_538) + 1);
      }
      if (local_4d8 != &local_4c8) {
        operator_delete(local_4d8,CONCAT71(uStack_4c7,local_4c8) + 1);
      }
      std::fstream::~fstream((istream *)local_240);
      local_4e8 = local_4e8 + 1;
    } while (local_4e8 != local_448);
  }
  return;
}

Assistant:

void
namingConventions::adjustForAllFiles(const std::vector<std::string> &inputFiles, std::vector<std::string> &oldNames,
                                     std::vector<Pda *> &pdas, bool forClass) {
    for (auto &file:inputFiles) {
        std::fstream buffer(file.c_str());
        std::string line;
        std::string editedstring;

        // loop over alle lines
        while (std::getline(buffer, line)) {
            std::stringstream stream(line);
            std::string word;
            // loop over elk woord op een line
            while (stream >> word) {
                // zoekt de juiste classname aan de hand van pda's, past word correct aan
                std::string longestFit;
                for (unsigned int i = 0; i < pdas.size(); ++i) {
                    Pda *tester = pdas[i];
                    if (tester->traverse(word)) {
                        if (forClass) {
                            word = editToNewName(word, oldNames[i], namingConventions::correctClassName(oldNames[i]));

                        } else {
                            word = editToNewName(word, oldNames[i], correctName(oldNames[i]));
                        }
                        if (word.size() > longestFit.size()) {
                            longestFit = word;
                        }

                    }
                }
                if (!longestFit.empty()) {
                    editedstring += longestFit + ' ';
                } else {
                    editedstring += word + ' ';
                }
            }
            editedstring += "\n";

        }
            // schrijft string naar file
            buffer.close();
            std::ofstream editedFile;
            editedFile.open(file, std::ofstream::out | std::ofstream::trunc);
            editedFile << editedstring;
            editedFile.close();

    }
}